

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgemv.c
# Opt level: O1

void zgemv_(char *trans,integer *m,integer *n,doublecomplex *alpha,doublecomplex *a,integer *lda,
           doublecomplex *x,integer *incx,doublecomplex *beta,doublecomplex *y,integer *incy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  doublecomplex *pdVar7;
  uint *puVar8;
  double *pdVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  integer *piVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  doublecomplex z__3;
  int local_ac;
  doublecomplex *local_a8;
  uint *local_a0;
  ulong local_98;
  int *local_90;
  ulong local_88;
  double local_80;
  char *local_78;
  double *local_70;
  ulong local_68;
  ulong local_60;
  int *local_58;
  doublecomplex *local_50;
  doublecomplex local_48;
  double *local_38;
  
  local_ac = 0;
  bVar4 = *trans;
  local_60 = (ulong)bVar4;
  if ((bVar4 - 0x43 < 0x12) && ((0x20801U >> (bVar4 - 0x43 & 0x1f) & 1) != 0)) {
    iVar16 = *m;
    if (iVar16 < 0) {
      local_ac = 2;
    }
    else if (*n < 0) {
      local_ac = 3;
    }
    else {
      iVar13 = 1;
      if (1 < iVar16) {
        iVar13 = iVar16;
      }
      if (*lda < iVar13) {
        local_ac = 6;
      }
      else if (*incx == 0) {
        local_ac = 8;
      }
      else if (*incy == 0) {
        local_ac = 0xb;
      }
    }
  }
  else {
    local_ac = 1;
  }
  local_a8 = a;
  local_a0 = (uint *)m;
  if (local_ac == 0) {
    iVar16 = *m;
    if (((iVar16 != 0) && (iVar13 = *n, iVar13 != 0)) &&
       (((alpha->r != 0.0 || (((NAN(alpha->r) || (alpha->i != 0.0)) || (NAN(alpha->i))))) ||
        ((((beta->r != 1.0 || (NAN(beta->r))) || (beta->i != 0.0)) || (NAN(beta->i))))))) {
      puVar8 = (uint *)n;
      if (bVar4 == 0x4e) {
        puVar8 = (uint *)m;
      }
      uVar10 = *puVar8;
      uVar12 = (ulong)uVar10;
      local_90 = (int *)(long)*incx;
      local_98 = CONCAT44(local_98._4_4_,1);
      if ((long)local_90 < 1) {
        piVar15 = m;
        if (bVar4 == 0x4e) {
          piVar15 = n;
        }
        local_98 = CONCAT44(local_98._4_4_,1 - (*piVar15 + -1) * *incx);
      }
      iVar14 = *incy;
      lVar19 = (long)iVar14;
      uVar6 = 1 - (uVar10 - 1) * iVar14;
      if (0 < lVar19) {
        uVar6 = 1;
      }
      local_88 = (ulong)uVar6;
      dVar21 = beta->r;
      local_78 = trans;
      if (((dVar21 != 1.0) || (NAN(dVar21))) || ((beta->i != 0.0 || (NAN(beta->i))))) {
        if (iVar14 == 1) {
          if (((dVar21 != 0.0) || (NAN(dVar21))) || ((beta->i != 0.0 || (NAN(beta->i))))) {
            if (0 < (int)uVar10) {
              lVar17 = 0;
              do {
                dVar21 = beta->r;
                dVar22 = beta->i;
                dVar1 = *(double *)((long)&y->r + lVar17);
                dVar2 = *(double *)((long)&y->i + lVar17);
                *(double *)((long)&y->r + lVar17) = dVar21 * dVar1 - dVar2 * dVar22;
                *(double *)((long)&y->i + lVar17) = dVar21 * dVar2 + dVar1 * dVar22;
                lVar17 = lVar17 + 0x10;
              } while (uVar12 << 4 != lVar17);
            }
          }
          else if (0 < (int)uVar10) {
            local_80 = (double)CONCAT44(local_80._4_4_,iVar13);
            memset(y,0,uVar12 << 4);
            iVar13 = local_80._0_4_;
          }
        }
        else if ((((dVar21 != 0.0) || (NAN(dVar21))) || (beta->i != 0.0)) || (NAN(beta->i))) {
          if (0 < (int)uVar10) {
            pdVar9 = &y[(long)(int)uVar6 + -1].i;
            do {
              dVar21 = beta->r;
              dVar22 = beta->i;
              dVar1 = ((doublecomplex *)(pdVar9 + -1))->r;
              dVar2 = *pdVar9;
              ((doublecomplex *)(pdVar9 + -1))->r = dVar21 * dVar1 - dVar2 * dVar22;
              *pdVar9 = dVar21 * dVar2 + dVar1 * dVar22;
              pdVar9 = pdVar9 + lVar19 * 2;
              uVar10 = (int)uVar12 - 1;
              uVar12 = (ulong)uVar10;
            } while (uVar10 != 0);
          }
        }
        else if (0 < (int)uVar10) {
          pdVar7 = y + (long)(int)uVar6 + -1;
          do {
            pdVar7->r = 0.0;
            pdVar7->i = 0.0;
            pdVar7 = pdVar7 + lVar19;
            uVar10 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar10;
          } while (uVar10 != 0);
        }
      }
      if (((alpha->r != 0.0) || (NAN(alpha->r))) || ((alpha->i != 0.0 || (NAN(alpha->i))))) {
        if (*local_78 == 'N') {
          if (iVar14 == 1) {
            if (0 < iVar13) {
              lVar19 = (long)(int)local_98;
              iVar11 = 0;
              iVar14 = 1;
              do {
                dVar21 = x[lVar19 + -1].r;
                if ((((dVar21 != 0.0) || (NAN(dVar21))) ||
                    ((x[lVar19 + -1].i != 0.0 || (NAN(x[lVar19 + -1].i))))) && (0 < iVar16)) {
                  dVar22 = alpha->r * dVar21 - x[lVar19 + -1].i * alpha->i;
                  dVar21 = alpha->r * x[lVar19 + -1].i + dVar21 * alpha->i;
                  iVar5 = *lda;
                  lVar17 = 0;
                  do {
                    dVar1 = *(double *)((long)&local_a8[(long)iVar11 * (long)iVar5].r + lVar17);
                    dVar2 = *(double *)((long)&local_a8[(long)iVar11 * (long)iVar5].i + lVar17);
                    *(double *)((long)&y->r + lVar17) =
                         dVar22 * dVar1 + dVar2 * -dVar21 + *(double *)((long)&y->r + lVar17);
                    *(double *)((long)&y->i + lVar17) =
                         dVar2 * dVar22 + dVar1 * dVar21 + *(double *)((long)&y->i + lVar17);
                    lVar17 = lVar17 + 0x10;
                  } while ((ulong)(iVar16 + 1) * 0x10 + -0x10 != lVar17);
                }
                lVar19 = lVar19 + (long)local_90;
                iVar11 = iVar11 + 1;
                bVar20 = iVar14 != iVar13;
                iVar14 = iVar14 + 1;
              } while (bVar20);
            }
          }
          else if (0 < iVar13) {
            lVar17 = (long)(int)local_98;
            iVar11 = 0;
            iVar14 = 1;
            do {
              dVar21 = x[lVar17 + -1].r;
              if (((((dVar21 != 0.0) || (NAN(dVar21))) || (x[lVar17 + -1].i != 0.0)) ||
                  (NAN(x[lVar17 + -1].i))) && (0 < iVar16)) {
                dVar22 = alpha->r * dVar21 - x[lVar17 + -1].i * alpha->i;
                dVar21 = alpha->r * x[lVar17 + -1].i + dVar21 * alpha->i;
                iVar5 = *lda;
                lVar18 = 0;
                pdVar9 = &y[(long)(int)local_88 + -1].i;
                do {
                  dVar1 = *(double *)((long)&local_a8[(long)iVar11 * (long)iVar5].r + lVar18);
                  dVar2 = *(double *)((long)&local_a8[(long)iVar11 * (long)iVar5].i + lVar18);
                  dVar3 = *pdVar9;
                  ((doublecomplex *)(pdVar9 + -1))->r =
                       dVar22 * dVar1 + dVar2 * -dVar21 + ((doublecomplex *)(pdVar9 + -1))->r;
                  *pdVar9 = dVar2 * dVar22 + dVar1 * dVar21 + dVar3;
                  lVar18 = lVar18 + 0x10;
                  pdVar9 = pdVar9 + lVar19 * 2;
                } while ((ulong)(iVar16 + 1) * 0x10 + -0x10 != lVar18);
              }
              lVar17 = lVar17 + (long)local_90;
              iVar11 = iVar11 + 1;
              bVar20 = iVar14 != iVar13;
              iVar14 = iVar14 + 1;
            } while (bVar20);
          }
        }
        else {
          local_58 = n;
          local_50 = alpha;
          if ((int)local_90 == 1) {
            if (0 < *n) {
              local_70 = &local_a8->i;
              local_98 = 1;
              local_68 = 0;
              local_90 = lda;
              do {
                uVar10 = *local_a0;
                iVar16 = (int)local_68;
                if ((char)local_60 == 'T') {
                  if ((int)uVar10 < 1) {
LAB_001208f6:
                    local_80 = 0.0;
                    local_78 = (char *)0x0;
                  }
                  else {
                    lVar19 = (long)iVar16 * (long)*local_90;
                    local_78 = (char *)0x0;
                    lVar17 = 0;
                    local_80 = 0.0;
                    do {
                      dVar21 = *(double *)((long)local_70 + lVar17 + lVar19 * 0x10 + -8);
                      dVar22 = *(double *)((long)local_70 + lVar17 + lVar19 * 0x10);
                      dVar1 = *(double *)((long)&x->r + lVar17);
                      dVar2 = *(double *)((long)&x->i + lVar17);
                      local_78 = (char *)((double)local_78 + (dVar21 * dVar1 - dVar2 * dVar22));
                      local_80 = local_80 + dVar21 * dVar2 + dVar1 * dVar22;
                      lVar17 = lVar17 + 0x10;
                    } while ((ulong)uVar10 << 4 != lVar17);
                  }
                }
                else {
                  if ((int)uVar10 < 1) goto LAB_001208f6;
                  local_78 = (char *)0x0;
                  lVar19 = 0;
                  local_80 = 0.0;
                  pdVar9 = &x->i;
                  pdVar7 = local_a8;
                  do {
                    d_cnjg(&local_48,pdVar7 + (long)*local_90 * (long)iVar16);
                    local_78 = (char *)((double)local_78 +
                                       (local_48.r * ((doublecomplex *)(pdVar9 + -1))->r -
                                       *pdVar9 * local_48.i));
                    local_80 = local_80 +
                               local_48.r * *pdVar9 +
                               ((doublecomplex *)(pdVar9 + -1))->r * local_48.i;
                    lVar19 = lVar19 + 1;
                    pdVar7 = pdVar7 + 1;
                    pdVar9 = pdVar9 + 2;
                  } while (lVar19 < (int)*local_a0);
                }
                dVar21 = local_50->r;
                dVar22 = local_50->i;
                iVar16 = (int)local_88;
                dVar1 = y[(long)iVar16 + -1].i;
                y[(long)iVar16 + -1].r =
                     (dVar21 * (double)local_78 - local_80 * dVar22) + y[(long)iVar16 + -1].r;
                y[(long)iVar16 + -1].i = dVar21 * local_80 + (double)local_78 * dVar22 + dVar1;
                local_88 = (ulong)(uint)(iVar16 + *incy);
                iVar16 = (int)local_98;
                local_68 = (ulong)((int)local_68 + 1);
                local_98 = (ulong)(iVar16 + 1);
              } while (iVar16 < *local_58);
            }
          }
          else if (0 < *n) {
            local_70 = &local_a8->i;
            local_38 = &x[(long)(int)local_98 + -1].i;
            local_68 = 1;
            local_90 = (int *)0x0;
            do {
              uVar10 = *local_a0;
              iVar16 = (int)local_90;
              if ((char)local_60 == 'T') {
                if ((int)uVar10 < 1) {
LAB_00120c59:
                  local_80 = 0.0;
                  local_78 = (char *)0x0;
                }
                else {
                  lVar19 = (long)iVar16 * (long)*lda;
                  local_78 = (char *)0x0;
                  lVar17 = 0;
                  local_80 = 0.0;
                  pdVar9 = local_38;
                  do {
                    dVar21 = *(double *)((long)local_70 + lVar17 + lVar19 * 0x10 + -8);
                    dVar22 = *(double *)((long)local_70 + lVar17 + lVar19 * 0x10);
                    local_78 = (char *)((double)local_78 +
                                       (dVar21 * ((doublecomplex *)(pdVar9 + -1))->r -
                                       *pdVar9 * dVar22));
                    local_80 = local_80 +
                               dVar21 * *pdVar9 + ((doublecomplex *)(pdVar9 + -1))->r * dVar22;
                    lVar17 = lVar17 + 0x10;
                    pdVar9 = pdVar9 + (long)*incx * 2;
                  } while ((ulong)uVar10 << 4 != lVar17);
                }
              }
              else {
                if ((int)uVar10 < 1) goto LAB_00120c59;
                local_78 = (char *)0x0;
                lVar19 = 0;
                local_80 = 0.0;
                iVar13 = (int)local_98;
                do {
                  d_cnjg(&local_48,local_a8 + (long)*lda * (long)iVar16 + lVar19);
                  lVar17 = (long)iVar13;
                  lVar18 = (long)iVar13;
                  local_78 = (char *)((double)local_78 +
                                     (local_48.r * x[lVar17 + -1].r - x[lVar18 + -1].i * local_48.i)
                                     );
                  iVar13 = iVar13 + *incx;
                  local_80 = local_80 +
                             local_48.r * x[lVar18 + -1].i + x[lVar17 + -1].r * local_48.i;
                  lVar19 = lVar19 + 1;
                } while ((int)lVar19 < (int)*local_a0);
              }
              dVar21 = local_50->r;
              dVar22 = local_50->i;
              iVar16 = (int)local_88;
              dVar1 = y[(long)iVar16 + -1].i;
              y[(long)iVar16 + -1].r =
                   (dVar21 * (double)local_78 - local_80 * dVar22) + y[(long)iVar16 + -1].r;
              y[(long)iVar16 + -1].i = dVar21 * local_80 + (double)local_78 * dVar22 + dVar1;
              local_88 = (ulong)(uint)(iVar16 + *incy);
              iVar16 = (int)local_68;
              local_90 = (int *)(ulong)((int)local_90 + 1);
              local_68 = (ulong)(iVar16 + 1);
            } while (iVar16 < *local_58);
          }
        }
      }
    }
  }
  else {
    input_error("ZGEMV ",&local_ac);
  }
  return;
}

Assistant:

void zgemv_(char *trans, integer *m, integer *n, 
	doublecomplex *alpha, doublecomplex *a, integer *lda, doublecomplex *
	x, integer *incx, doublecomplex *beta, doublecomplex *y, integer *
	incy)
{


    /* System generated locals */

    doublecomplex z__1, z__2, z__3;

    /* Builtin functions */
    void d_cnjg(doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp;
    integer lenx, leny, i, j;
    integer ix, iy, jx, jy, kx, ky;
    logical noconj;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZGEMV  performs one of the matrix-vector operations   

       y := alpha*A*x + beta*y,   or   y := alpha*A'*x + beta*y,   or   

       y := alpha*conjg( A' )*x + beta*y,   

    where alpha and beta are scalars, x and y are vectors and A is an   
    m by n matrix.   

    Parameters   
    ==========   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the operation to be performed as   
             follows:   

                TRANS = 'N' or 'n'   y := alpha*A*x + beta*y.   

                TRANS = 'T' or 't'   y := alpha*A'*x + beta*y.   

                TRANS = 'C' or 'c'   y := alpha*conjg( A' )*x + beta*y.   

             Unchanged on exit.   

    M      - INTEGER.   
             On entry, M specifies the number of rows of the matrix A.   
             M must be at least zero.   
             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the number of columns of the matrix A. 
  
             N must be at least zero.   
             Unchanged on exit.   

    ALPHA  - COMPLEX*16      .   
             On entry, ALPHA specifies the scalar alpha.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry, the leading m by n part of the array A must   
             contain the matrix of coefficients.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, m ).   
             Unchanged on exit.   

    X      - COMPLEX*16       array of DIMENSION at least   
             ( 1 + ( n - 1 )*abs( INCX ) ) when TRANS = 'N' or 'n'   
             and at least   
             ( 1 + ( m - 1 )*abs( INCX ) ) otherwise.   
             Before entry, the incremented array X must contain the   
             vector x.   
             Unchanged on exit.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   

    BETA   - COMPLEX*16      .   
             On entry, BETA specifies the scalar beta. When BETA is   
             supplied as zero then Y need not be set on input.   
             Unchanged on exit.   

    Y      - COMPLEX*16       array of DIMENSION at least   
             ( 1 + ( m - 1 )*abs( INCY ) ) when TRANS = 'N' or 'n'   
             and at least   
             ( 1 + ( n - 1 )*abs( INCY ) ) otherwise.   
             Before entry with BETA non-zero, the incremented array Y   
             must contain the vector y. On exit, Y is overwritten by the 
  
             updated vector y.   

    INCY   - INTEGER.   
             On entry, INCY specifies the increment for the elements of   
             Y. INCY must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   

       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]
#define Y(I) y[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
	 strncmp(trans, "C", 1)!=0 ) {
	info = 1;
    } else if (*m < 0) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*lda < max(1,*m)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    } else if (*incy == 0) {
	info = 11;
    }
    if (info != 0) {
	input_error("ZGEMV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (alpha->r == 0. && alpha->i == 0.
			       && beta->r == 1. && beta->i == 0.)) {
	return;
    }

    noconj = ( strncmp(trans, "T", 1)==0 );

/*     Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */

    if (strncmp(trans, "N", 1)==0) {
	lenx = *n;
	leny = *m;
    } else {
	lenx = *m;
	leny = *n;
    }
    if (*incx > 0) {
	kx = 1;
    } else {
	kx = 1 - (lenx - 1) * *incx;
    }
    if (*incy > 0) {
	ky = 1;
    } else {
	ky = 1 - (leny - 1) * *incy;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A.   

       First form  y := beta*y. */

    if (beta->r != 1. || beta->i != 0.) {
	if (*incy == 1) {
	    if (beta->r == 0. && beta->i == 0.) {
		for (i = 1; i <= leny; ++i) {
		    Y(i).r = 0., Y(i).i = 0.;
/* L10: */
		}
	    } else {
		for (i = 1; i <= leny; ++i) {
		    z__1.r = beta->r * Y(i).r - beta->i * Y(i).i, 
			    z__1.i = beta->r * Y(i).i + beta->i * Y(i)
			    .r;
		    Y(i).r = z__1.r, Y(i).i = z__1.i;
/* L20: */
		}
	    }
	} else {
	    iy = ky;
	    if (beta->r == 0. && beta->i == 0.) {
		for (i = 1; i <= leny; ++i) {
		    Y(iy).r = 0., Y(iy).i = 0.;
		    iy += *incy;
/* L30: */
		}
	    } else {
		for (i = 1; i <= leny; ++i) {
		    z__1.r = beta->r * Y(iy).r - beta->i * Y(iy).i, 
			    z__1.i = beta->r * Y(iy).i + beta->i * Y(iy)
			    .r;
		    Y(iy).r = z__1.r, Y(iy).i = z__1.i;
		    iy += *incy;
/* L40: */
		}
	    }
	}
    }
    if (alpha->r == 0. && alpha->i == 0.) {
	return;
    }
    if (strncmp(trans, "N", 1)==0) {

/*        Form  y := alpha*A*x + y. */

	jx = kx;
	if (*incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0.) {
		    z__1.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__1.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    temp.r = z__1.r, temp.i = z__1.i;
		    for (i = 1; i <= *m; ++i) {
			z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				z__2.i = temp.r * A(i,j).i + temp.i * A(i,j)
				.r;
			z__1.r = Y(i).r + z__2.r, z__1.i = Y(i).i + 
				z__2.i;
			Y(i).r = z__1.r, Y(i).i = z__1.i;
/* L50: */
		    }
		}
		jx += *incx;
/* L60: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0.) {
		    z__1.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__1.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    temp.r = z__1.r, temp.i = z__1.i;
		    iy = ky;
		    for (i = 1; i <= *m; ++i) {
			z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				z__2.i = temp.r * A(i,j).i + temp.i * A(i,j)
				.r;
			z__1.r = Y(iy).r + z__2.r, z__1.i = Y(iy).i + 
				z__2.i;
			Y(iy).r = z__1.r, Y(iy).i = z__1.i;
			iy += *incy;
/* L70: */
		    }
		}
		jx += *incx;
/* L80: */
	    }
	}
    } else {

/*        Form  y := alpha*A'*x + y  or  y := alpha*conjg( A' )*x + y.
 */

	jy = ky;
	if (*incx == 1) {
	    for (j = 1; j <= *n; ++j) {
		temp.r = 0., temp.i = 0.;
		if (noconj) {
		    for (i = 1; i <= *m; ++i) {
			z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(i)
				.i, z__2.i = A(i,j).r * X(i).i + A(i,j)
				.i * X(i).r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
/* L90: */
		    }
		} else {
		    for (i = 1; i <= *m; ++i) {
			d_cnjg(&z__3, &A(i,j));
			z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				z__2.i = z__3.r * X(i).i + z__3.i * X(i)
				.r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
/* L100: */
		    }
		}
		z__2.r = alpha->r * temp.r - alpha->i * temp.i, z__2.i = 
			alpha->r * temp.i + alpha->i * temp.r;
		z__1.r = Y(jy).r + z__2.r, z__1.i = Y(jy).i + z__2.i;
		Y(jy).r = z__1.r, Y(jy).i = z__1.i;
		jy += *incy;
/* L110: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		temp.r = 0., temp.i = 0.;
		ix = kx;
		if (noconj) {
		    for (i = 1; i <= *m; ++i) {
			z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(ix)
				.i, z__2.i = A(i,j).r * X(ix).i + A(i,j)
				.i * X(ix).r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
			ix += *incx;
/* L120: */
		    }
		} else {
		    for (i = 1; i <= *m; ++i) {
			d_cnjg(&z__3, &A(i,j));
			z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				z__2.i = z__3.r * X(ix).i + z__3.i * X(ix)
				.r;
			z__1.r = temp.r + z__2.r, z__1.i = temp.i + z__2.i;
			temp.r = z__1.r, temp.i = z__1.i;
			ix += *incx;
/* L130: */
		    }
		}
		z__2.r = alpha->r * temp.r - alpha->i * temp.i, z__2.i = 
			alpha->r * temp.i + alpha->i * temp.r;
		z__1.r = Y(jy).r + z__2.r, z__1.i = Y(jy).i + z__2.i;
		Y(jy).r = z__1.r, Y(jy).i = z__1.i;
		jy += *incy;
/* L140: */
	    }
	}
    }

    return;

/*     End of ZGEMV . */

}